

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UDate __thiscall
icu_63::CalendarAstronomer::getSunTime(CalendarAstronomer *this,double desired,UBool next)

{
  UDate UVar1;
  AngleFunc local_28;
  SunTimeAngleFunc func;
  UBool next_local;
  double desired_local;
  CalendarAstronomer *this_local;
  
  func.super_AngleFunc._vptr_AngleFunc._7_1_ = next;
  SunTimeAngleFunc::SunTimeAngleFunc((SunTimeAngleFunc *)&local_28);
  UVar1 = timeOfAngle(this,&local_28,desired,365.242191,60000.0,
                      func.super_AngleFunc._vptr_AngleFunc._7_1_);
  SunTimeAngleFunc::~SunTimeAngleFunc((SunTimeAngleFunc *)&local_28);
  return UVar1;
}

Assistant:

UDate CalendarAstronomer::getSunTime(double desired, UBool next)
{
    SunTimeAngleFunc func;
    return timeOfAngle( func,
                        desired,
                        TROPICAL_YEAR,
                        MINUTE_MS,
                        next);
}